

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

basic_substring<const_char> __thiscall
c4::basic_substring<const_char>::_first_integral_span
          (basic_substring<const_char> *this,size_t skip_start)

{
  code *pcVar1;
  bool bVar2;
  error_flags eVar3;
  char *s_;
  ulong uVar4;
  size_t len_;
  ulong uVar5;
  byte bVar6;
  uint uVar7;
  basic_substring<const_char> bVar8;
  basic_substring<const_char> local_20;
  
  uVar5 = this->len;
  if ((uVar5 == 0) || (this->str == (char *)0x0)) {
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      pcVar1 = (code *)swi(3);
      bVar8 = (basic_substring<const_char>)(*pcVar1)();
      return bVar8;
    }
    handle_error(0x20a4ad,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x1831,"!empty()");
  }
  if (uVar5 == skip_start) {
    s_ = this->str;
LAB_001ba302:
    uVar5 = 0;
    goto LAB_001ba304;
  }
  if (uVar5 <= skip_start) {
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      pcVar1 = (code *)swi(3);
      bVar8 = (basic_substring<const_char>)(*pcVar1)();
      return bVar8;
    }
    handle_error(0x20a4ad,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x1834,"skip_start < len");
  }
  s_ = this->str;
  len_ = skip_start;
  if (skip_start + 3 <= uVar5) {
    uVar4 = skip_start;
    if (s_[skip_start] == '0') {
      bVar6 = s_[skip_start + 1] & 0xdf;
      if (bVar6 == 0x42) {
        for (uVar4 = skip_start + 2; uVar4 < uVar5; uVar4 = uVar4 + 1) {
          bVar6 = s_[uVar4];
          if ((bVar6 & 0xfe) != 0x30) {
            if ((uVar4 <= skip_start + 2) ||
               (((uVar7 = (uint)bVar6, 0x3b < bVar6 ||
                 ((0x800120100002601U >> ((ulong)uVar7 & 0x3f) & 1) == 0)) &&
                ((uVar7 != 0x5d && (uVar7 != 0x7d)))))) goto LAB_001ba302;
            basic_substring(&local_20,s_,uVar4);
            s_ = local_20.str;
            uVar5 = local_20.len;
            break;
          }
        }
        goto LAB_001ba304;
      }
      if (bVar6 == 0x4f) {
        for (uVar4 = skip_start + 2; uVar4 < uVar5; uVar4 = uVar4 + 1) {
          bVar6 = s_[uVar4];
          if ((bVar6 & 0xf8) != 0x30) {
            if ((uVar4 <= skip_start + 2) ||
               (((uVar7 = (uint)bVar6, 0x3b < bVar6 ||
                 ((0x800120100002601U >> ((ulong)uVar7 & 0x3f) & 1) == 0)) &&
                ((uVar7 != 0x5d && (uVar7 != 0x7d)))))) goto LAB_001ba302;
            basic_substring(&local_20,s_,uVar4);
            s_ = local_20.str;
            uVar5 = local_20.len;
            break;
          }
        }
        goto LAB_001ba304;
      }
      if (bVar6 == 0x58) {
        for (uVar4 = skip_start + 2; uVar4 < uVar5; uVar4 = uVar4 + 1) {
          bVar6 = s_[uVar4];
          if (9 < (byte)(bVar6 - 0x30)) {
            if ((0x25 < bVar6 - 0x41) ||
               ((0x3f0000003fU >> ((ulong)(bVar6 - 0x41) & 0x3f) & 1) == 0)) {
              if ((uVar4 <= skip_start + 2) ||
                 ((((0x3b < bVar6 || ((0x800120100002601U >> ((ulong)bVar6 & 0x3f) & 1) == 0)) &&
                   (bVar6 != 0x5d)) && (bVar6 != 0x7d)))) goto LAB_001ba302;
              basic_substring(&local_20,s_,uVar4);
              s_ = local_20.str;
              uVar5 = local_20.len;
              break;
            }
          }
        }
        goto LAB_001ba304;
      }
    }
    else {
      for (; uVar4 < uVar5; uVar4 = uVar4 + 1) {
        bVar6 = s_[uVar4];
        if (9 < (byte)(bVar6 - 0x30)) {
          if ((uVar4 <= skip_start) ||
             ((((0x3b < bVar6 || ((0x800120100002601U >> ((ulong)(uint)bVar6 & 0x3f) & 1) == 0)) &&
               (bVar6 != 0x5d)) && (bVar6 != 0x7d)))) goto LAB_001ba302;
          basic_substring(&local_20,s_,uVar4);
          s_ = local_20.str;
          uVar5 = local_20.len;
          goto LAB_001ba304;
        }
      }
    }
  }
  for (; len_ < uVar5; len_ = len_ + 1) {
    bVar6 = s_[len_];
    if (9 < (byte)(bVar6 - 0x30)) {
      if ((len_ <= skip_start) ||
         (((0x3b < bVar6 || ((0x800120100002601U >> ((ulong)(uint)bVar6 & 0x3f) & 1) == 0)) &&
          ((bVar6 != 0x5d && (bVar6 != 0x7d)))))) goto LAB_001ba302;
      basic_substring(&local_20,s_,len_);
      s_ = local_20.str;
      uVar5 = local_20.len;
      break;
    }
  }
LAB_001ba304:
  bVar8.len = uVar5;
  bVar8.str = s_;
  return bVar8;
}

Assistant:

basic_substring _first_integral_span(size_t skip_start) const
    {
        C4_ASSERT(!empty());
        if(skip_start == len)
            return first(0);
        C4_ASSERT(skip_start < len);
        if(len >= skip_start + 3)
        {
            if(str[skip_start] != '0')
            {
                for(size_t i = skip_start; i < len; ++i)
                {
                    char c = str[i];
                    if(c < '0' || c > '9')
                        return i > skip_start && _is_delim_char(c) ? first(i) : first(0);
                }
            }
            else
            {
                char next = str[skip_start + 1];
                if(next == 'x' || next == 'X')
                {
                    skip_start += 2;
                    for(size_t i = skip_start; i < len; ++i)
                    {
                        const char c = str[i];
                        if( ! _is_hex_char(c))
                            return i > skip_start && _is_delim_char(c) ? first(i) : first(0);
                    }
                    return *this;
                }
                else if(next == 'b' || next == 'B')
                {
                    skip_start += 2;
                    for(size_t i = skip_start; i < len; ++i)
                    {
                        const char c = str[i];
                        if(c != '0' && c != '1')
                            return i > skip_start && _is_delim_char(c) ? first(i) : first(0);
                    }
                    return *this;
                }
                else if(next == 'o' || next == 'O')
                {
                    skip_start += 2;
                    for(size_t i = skip_start; i < len; ++i)
                    {
                        const char c = str[i];
                        if(c < '0' || c > '7')
                            return i > skip_start && _is_delim_char(c) ? first(i) : first(0);
                    }
                    return *this;
                }
            }
        }
        // must be a decimal, or it is not a an number
        for(size_t i = skip_start; i < len; ++i)
        {
            const char c = str[i];
            if(c < '0' || c > '9')
                return i > skip_start && _is_delim_char(c) ? first(i) : first(0);
        }
        return *this;
    }